

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O3

int CServer::NewClientCallback(int ClientID,void *pUser)

{
  char cVar1;
  CClient *this;
  
  cVar1 = (**(code **)(**(long **)((long)pUser + 0x18) + 0x78))
                    (*(long **)((long)pUser + 0x18),ClientID);
  if (cVar1 != '\0') {
    (**(code **)(**(long **)((long)pUser + 0x18) + 0x60))
              (*(long **)((long)pUser + 0x18),ClientID,"removing dummy");
  }
  this = (CClient *)((long)pUser + (long)ClientID * 0x195f0 + 0x38);
  this->m_State = 1;
  this->m_Latency = 0;
  *(undefined1 *)((long)pUser + (long)ClientID * 0x195f0 + 0x19588) = 0;
  *(undefined1 *)((long)pUser + (long)ClientID * 0x195f0 + 0x195c9) = 0;
  *(undefined4 *)((long)pUser + (long)ClientID * 0x195f0 + 0x19600) = 0xffffffff;
  *(undefined8 *)((long)pUser + (long)ClientID * 0x195f0 + 0x19608) = 0;
  *(undefined2 *)((long)pUser + (long)ClientID * 0x195f0 + 0x19614) = 0;
  *(undefined8 *)((long)pUser + (long)ClientID * 0x195f0 + 0x19618) = 0;
  *(undefined8 *)((long)pUser + (long)ClientID * 0x195f0 + 0x19620) = 0;
  CClient::Reset(this);
  return 0;
}

Assistant:

int CServer::NewClientCallback(int ClientID, void *pUser)
{
	CServer *pThis = (CServer *)pUser;

	// Remove non human player on same slot
	if(pThis->GameServer()->IsClientBot(ClientID))
	{
		pThis->GameServer()->OnClientDrop(ClientID, "removing dummy");
	}

	pThis->m_aClients[ClientID].m_State = CClient::STATE_AUTH;
	pThis->m_aClients[ClientID].m_aName[0] = 0;
	pThis->m_aClients[ClientID].m_aClan[0] = 0;
	pThis->m_aClients[ClientID].m_Country = -1;
	pThis->m_aClients[ClientID].m_Authed = AUTHED_NO;
	pThis->m_aClients[ClientID].m_AuthTries = 0;
	pThis->m_aClients[ClientID].m_pRconCmdToSend = 0;
	pThis->m_aClients[ClientID].m_pMapListEntryToSend = 0;
	pThis->m_aClients[ClientID].m_NoRconNote = false;
	pThis->m_aClients[ClientID].m_Quitting = false;
	pThis->m_aClients[ClientID].m_Latency = 0;
	pThis->m_aClients[ClientID].Reset();

	return 0;
}